

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent *indent)

{
  cmCompiledGeneratorExpression *this_00;
  char *pcVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  string value;
  allocator local_b1;
  cmCPackPropertiesGenerator *local_b0;
  Indent *local_a8;
  _Rb_tree_node_base *local_a0;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a8 = indent;
  this_00 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_b0 = this;
  local_98 = config;
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,this->Makefile,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&local_70);
  std::__cxx11::string::string((string *)&local_50,pcVar1,(allocator *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  local_a0 = &(local_b0->InstalledFile->Properties)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var3 = (local_b0->InstalledFile->Properties)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left; p_Var3 != local_a0;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    cmScriptGeneratorIndent::Write(local_a8,os);
    poVar2 = std::operator<<(os,"set_property(INSTALL ");
    cmOutputConverter::EscapeForCMake(&local_70,&local_50);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2," PROPERTY ");
    cmOutputConverter::EscapeForCMake(&local_90,(string *)(p_Var3 + 1));
    std::operator<<(poVar2,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    for (p_Var4 = *(_Base_ptr *)(p_Var3 + 2); p_Var4 != p_Var3[2]._M_parent;
        p_Var4 = (_Base_ptr)&p_Var4->_M_parent) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      pcVar1 = cmCompiledGeneratorExpression::Evaluate
                         (*(cmCompiledGeneratorExpression **)p_Var4,local_b0->Makefile,local_98,
                          false,(cmTarget *)0x0,(cmTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,&local_90);
      std::__cxx11::string::string((string *)&local_70,pcVar1,&local_b1);
      std::__cxx11::string::~string((string *)&local_90);
      poVar2 = std::operator<<(os," ");
      cmOutputConverter::EscapeForCMake(&local_90,&local_70);
      std::operator<<(poVar2,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::operator<<(os,")\n");
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(std::ostream& os,
  const std::string& config, Indent const& indent)
{
  std::string const& expandedFileName =
      this->InstalledFile.GetNameExpression().Evaluate(this->Makefile, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for(cmInstalledFile::PropertyMapType::const_iterator i = properties.begin();
    i != properties.end(); ++i)
    {
    std::string const& name = i->first;
    cmInstalledFile::Property const& property = i->second;

    os << indent << "set_property(INSTALL " <<
      cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY " <<
      cmOutputConverter::EscapeForCMake(name);

    for(cmInstalledFile::ExpressionVectorType::const_iterator
      j = property.ValueExpressions.begin();
      j != property.ValueExpressions.end(); ++j)
      {
      std::string value = (*j)->Evaluate(this->Makefile, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
      }

    os << ")\n";
    }
}